

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O0

void pztopology::TPZLine::MapToSide<double>
               (int side,TPZVec<double> *InternalPar,TPZVec<double> *SidePar,
               TPZFMatrix<double> *JacToSide)

{
  int iVar1;
  long *in_RDX;
  TPZTransform<double> Transf;
  TPZTransform<double> TransfR;
  undefined4 in_stack_fffffffffffffc94;
  TPZTransform<double> *in_stack_fffffffffffffc98;
  TPZSavable in_stack_fffffffffffffca0;
  TPZVec<double> *in_stack_fffffffffffffca8;
  TPZSavable in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  
  SideToSideTransform(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8);
  TPZTransform<double>::TPZTransform
            ((TPZTransform<double> *)in_stack_fffffffffffffca0._vptr_TPZSavable);
  TPZTransform<double>::CopyFrom
            ((TPZTransform<double> *)in_stack_fffffffffffffca0._vptr_TPZSavable,
             in_stack_fffffffffffffc98);
  iVar1 = SideDimension(0x150e0d8);
  (**(code **)(*in_RDX + 0x18))(in_RDX,(long)iVar1);
  TPZTransform<double>::Apply
            ((TPZTransform<double> *)in_stack_fffffffffffffcb0._vptr_TPZSavable,
             in_stack_fffffffffffffca8,(TPZVec<double> *)in_stack_fffffffffffffca0._vptr_TPZSavable)
  ;
  TPZTransform<double>::Mult((TPZTransform<double> *)&stack0xfffffffffffffca0);
  TPZFMatrix<double>::operator=
            ((TPZFMatrix<double> *)in_stack_fffffffffffffc98,
             (TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffffc94,iVar1));
  TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x150e140);
  TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x150e14d);
  return;
}

Assistant:

void TPZLine::MapToSide(int side, TPZVec<T> &InternalPar, TPZVec<T> &SidePar, TPZFMatrix<T> &JacToSide) {
		TPZTransform<> TransfR = SideToSideTransform(NSides - 1, side);
        TPZTransform<T> Transf;
        Transf.CopyFrom(TransfR);
		SidePar.Resize(SideDimension(side));
		Transf.Apply(InternalPar,SidePar);
		
		JacToSide = Transf.Mult();
	}